

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vacuum.cpp
# Opt level: O3

void __thiscall wasm::Vacuum::visitIf(Vacuum *this,If *curr)

{
  Id IVar1;
  Id IVar2;
  If *pIVar3;
  Expression *arm;
  bool bVar4;
  int64_t iVar5;
  Expression **ppEVar6;
  If *pIVar7;
  Block *this_00;
  Drop *pDVar8;
  ulong in_RCX;
  Nop *output;
  optional<wasm::Type> type;
  Builder local_50;
  Builder builder;
  anon_class_16_2_3fdeafed optimizeArm;
  If *curr_local;
  
  pDVar8 = (Drop *)curr->condition;
  optimizeArm.curr = (If **)curr;
  if ((pDVar8->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id == ConstId)
  {
    iVar5 = Literal::getInteger((Literal *)&pDVar8->value);
    if (iVar5 == 0) {
      pDVar8 = (Drop *)curr->ifFalse;
      if (pDVar8 == (Drop *)0x0) {
        (curr->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression._id = NopId;
        (curr->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id = 0;
        return;
      }
    }
    else {
      pDVar8 = (Drop *)curr->ifTrue;
    }
  }
  else if ((pDVar8->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id !=
           1) {
    if (((((this->
           super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
           ).super_Pass.runner)->options).trapsNeverHappen == true) &&
       ((curr->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id != 1)) {
      optimizeArm.this = (Vacuum *)&optimizeArm.curr;
      arm = curr->ifFalse;
      builder.wasm = (Module *)this;
      if (curr->ifTrue->_id == UnreachableId) {
        local_50.wasm =
             (this->
             super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
             ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.
             super_PostWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.
             super_Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.currModule;
        this_00 = (Block *)MixedArena::allocSpace(&(local_50.wasm)->allocator,0x18,8);
        (((SpecificExpression<(wasm::Expression::Id)18> *)
         &this_00->super_SpecificExpression<(wasm::Expression::Id)1>)->super_Expression)._id =
             DropId;
        (((SpecificExpression<(wasm::Expression::Id)18> *)
         &this_00->super_SpecificExpression<(wasm::Expression::Id)1>)->super_Expression).type.id = 0
        ;
        (this_00->name).super_IString.str._M_len = (size_t)pDVar8;
        Drop::finalize((Drop *)this_00);
        if (arm != (Expression *)0x0) {
          type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._8_8_ = 0;
          type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)in_RCX;
          this_00 = Builder::makeSequence(&local_50,(Expression *)this_00,arm,type);
        }
        Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::replaceCurrent
                  ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
                   &(this->
                    super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                    ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
                   (Expression *)this_00);
        ppEVar6 = SmallVector<wasm::Expression_*,_10UL>::back
                            (&(this->
                              super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                              ).
                              super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                              .expressionStack);
        *ppEVar6 = (Expression *)this_00;
        return;
      }
      if ((arm != (Expression *)0x0) &&
         (bVar4 = visitIf::anon_class_16_2_3fdeafed::operator()
                            ((anon_class_16_2_3fdeafed *)&builder,arm,curr->ifTrue), bVar4)) {
        return;
      }
    }
    pIVar3 = optimizeArm.curr[4];
    if (pIVar3 == (If *)0x0) {
      if ((optimizeArm.curr[3]->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.
          _id != NopId) {
        return;
      }
      pIVar3 = optimizeArm.curr[2];
      pDVar8 = (Drop *)MixedArena::allocSpace
                                 (&((this->
                                    super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                                    ).
                                    super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                                    .
                                    super_PostWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                                    .super_Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.
                                   currModule)->allocator,0x18,8);
      (pDVar8->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
      (pDVar8->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
      pDVar8->value = (Expression *)pIVar3;
      Drop::finalize(pDVar8);
      Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::replaceCurrent
                ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
                 &(this->
                  super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                  ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
                 (Expression *)pDVar8);
      ppEVar6 = SmallVector<wasm::Expression_*,_10UL>::back
                          (&(this->
                            super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                            ).
                            super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                            .expressionStack);
      *ppEVar6 = (Expression *)pDVar8;
      return;
    }
    IVar1 = (pIVar3->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression._id;
    if (IVar1 == NopId) {
      optimizeArm.curr[4] = (If *)0x0;
      return;
    }
    IVar2 = (optimizeArm.curr[3]->super_SpecificExpression<(wasm::Expression::Id)2>).
            super_Expression._id;
    if (IVar2 != DropId) {
      if (IVar2 != NopId) {
        return;
      }
      optimizeArm.curr[3] = pIVar3;
      optimizeArm.curr[4] = (If *)0x0;
      pIVar3 = optimizeArm.curr[2];
      pIVar7 = (If *)MixedArena::allocSpace
                               (&((this->
                                  super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                                  ).
                                  super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                                  .
                                  super_PostWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                                  .super_Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.
                                 currModule)->allocator,0x20,8);
      (((SpecificExpression<(wasm::Expression::Id)15> *)
       &pIVar7->super_SpecificExpression<(wasm::Expression::Id)2>)->super_Expression)._id = UnaryId;
      (((SpecificExpression<(wasm::Expression::Id)15> *)
       &pIVar7->super_SpecificExpression<(wasm::Expression::Id)2>)->super_Expression).type.id = 0;
      *(UnaryOp *)&pIVar7->condition = EqZInt32;
      pIVar7->ifTrue = (Expression *)pIVar3;
      Unary::finalize((Unary *)pIVar7);
      optimizeArm.curr[2] = pIVar7;
      return;
    }
    if (IVar1 != DropId) {
      return;
    }
    pIVar7 = (If *)optimizeArm.curr[3]->condition;
    pIVar3 = (If *)pIVar3->condition;
    if ((pIVar7->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id !=
        (pIVar3->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id) {
      return;
    }
    optimizeArm.curr[3] = pIVar7;
    optimizeArm.curr[4] = pIVar3;
    If::finalize((If *)optimizeArm.curr,(optional<wasm::Type>)ZEXT116(0x12));
    builder.wasm = (this->
                   super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                   ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.
                   super_PostWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.
                   super_Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.currModule;
    pDVar8 = Builder::makeDrop(&builder,(Expression *)optimizeArm.curr);
  }
  Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::replaceCurrent
            ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
             &(this->
              super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
              ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
             (Expression *)pDVar8);
  ppEVar6 = SmallVector<wasm::Expression_*,_10UL>::back
                      (&(this->
                        super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                        ).
                        super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                        .expressionStack);
  *ppEVar6 = (Expression *)pDVar8;
  return;
}

Assistant:

void visitIf(If* curr) {
    // if the condition is a constant, just apply it
    // we can just return the ifTrue or ifFalse.
    if (auto* value = curr->condition->dynCast<Const>()) {
      Expression* child;
      if (value->value.getInteger()) {
        child = curr->ifTrue;
      } else {
        if (curr->ifFalse) {
          child = curr->ifFalse;
        } else {
          ExpressionManipulator::nop(curr);
          return;
        }
      }
      replaceCurrent(child);
      return;
    }
    // if the condition is unreachable, just return it
    if (curr->condition->type == Type::unreachable) {
      replaceCurrent(curr->condition);
      return;
    }
    // from here on, we can assume the condition executed

    // In trapsNeverHappen mode, a definitely-trapping arm can be assumed to not
    // happen. Such conditional code can be assumed to never be reached in this
    // mode.
    //
    // Ignore the case of an unreachable if, such as having both arms be
    // unreachable. In that case we'd need to fix up the IR to avoid changing
    // the type; leave that for DCE to simplify first. After checking that
    // curr->type != unreachable, we can assume that only one of the arms is
    // unreachable (at most).
    if (getPassOptions().trapsNeverHappen && curr->type != Type::unreachable) {
      auto optimizeArm = [&](Expression* arm, Expression* otherArm) {
        if (!arm->is<Unreachable>()) {
          return false;
        }
        Builder builder(*getModule());
        Expression* rep = builder.makeDrop(curr->condition);
        if (otherArm) {
          rep = builder.makeSequence(rep, otherArm);
        }
        replaceCurrent(rep);
        return true;
      };

      // As mentioned above, do not try to optimize both arms; leave that case
      // for DCE.
      if (optimizeArm(curr->ifTrue, curr->ifFalse) ||
          (curr->ifFalse && optimizeArm(curr->ifFalse, curr->ifTrue))) {
        return;
      }
    }

    if (curr->ifFalse) {
      if (curr->ifFalse->is<Nop>()) {
        curr->ifFalse = nullptr;
      } else if (curr->ifTrue->is<Nop>()) {
        curr->ifTrue = curr->ifFalse;
        curr->ifFalse = nullptr;
        curr->condition =
          Builder(*getModule()).makeUnary(EqZInt32, curr->condition);
      } else if (curr->ifTrue->is<Drop>() && curr->ifFalse->is<Drop>()) {
        // instead of dropping both sides, drop the if, if they are the same
        // type
        auto* left = curr->ifTrue->cast<Drop>()->value;
        auto* right = curr->ifFalse->cast<Drop>()->value;
        if (left->type == right->type) {
          curr->ifTrue = left;
          curr->ifFalse = right;
          curr->finalize();
          replaceCurrent(Builder(*getModule()).makeDrop(curr));
        }
      }
    } else {
      // This is an if without an else. If the body is empty, we do not need it.
      if (curr->ifTrue->is<Nop>()) {
        replaceCurrent(Builder(*getModule()).makeDrop(curr->condition));
      }
    }
  }